

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall
soul::heart::Parser::parseVariableAssignment
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder,AssignmentTarget *target)

{
  bool bVar1;
  int iVar2;
  Expression *source;
  undefined4 extraout_var;
  Expression *dest;
  undefined1 local_98 [8];
  pool_ptr<soul::heart::Expression> v;
  Expression *sourceValue;
  CodeLocation errorLocation;
  AssignmentTarget *target_local;
  FunctionBuilder *builder_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  errorLocation.location.data = "=";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x4aecb7);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"call");
  if (bVar1) {
    parseFunctionCall(this,state,builder,target);
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"read");
    if (bVar1) {
      parseReadStream(this,state,builder,target);
    }
    else {
      CodeLocation::CodeLocation
                ((CodeLocation *)&sourceValue,
                 &(this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ).location);
      source = parseExpression(this,state);
      iVar2 = (*(source->super_Object)._vptr_Object[2])();
      bVar1 = AssignmentTarget::checkType(target,(Type *)CONCAT44(extraout_var,iVar2));
      if (!bVar1) {
        Errors::incompatibleTargetType<>();
        CodeLocation::throwError((CodeLocation *)&sourceValue,(CompileMessage *)&v);
      }
      expectSemicolon(this);
      (*(source->super_Object)._vptr_Object[2])();
      AssignmentTarget::create
                ((AssignmentTarget *)local_98,(FunctionParseState *)target,(FunctionBuilder *)state,
                 (Type *)builder);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_98);
      if (bVar1) {
        dest = pool_ptr<soul::heart::Expression>::operator*
                         ((pool_ptr<soul::heart::Expression> *)local_98);
        BlockBuilder::addAssignment(&builder->super_BlockBuilder,dest,source);
      }
      pool_ptr<soul::heart::Expression>::~pool_ptr((pool_ptr<soul::heart::Expression> *)local_98);
      CodeLocation::~CodeLocation((CodeLocation *)&sourceValue);
    }
  }
  return;
}

Assistant:

void parseVariableAssignment (FunctionParseState& state, FunctionBuilder& builder, const AssignmentTarget& target)
    {
        expect (HEARTOperator::assign);

        if (matchIf ("call"))
            return parseFunctionCall (state, builder, target);

        if (matchIf ("read"))
            return parseReadStream (state, builder, target);

        auto errorLocation = location;
        auto& sourceValue = parseExpression (state);

        if (! target.checkType (sourceValue.getType()))
            errorLocation.throwError (Errors::incompatibleTargetType());

        expectSemicolon();

        if (auto v = target.create (state, builder, sourceValue.getType()))
            builder.addAssignment (*v, sourceValue);
    }